

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internals.h
# Opt level: O1

void pybind11::detail::translate_exception(exception_ptr *p)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  long *plVar4;
  undefined8 uVar5;
  int iVar6;
  undefined1 auVar7 [12];
  void *local_20;
  
  local_20 = p->_M_exception_object;
  if (local_20 != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_addref();
    auVar7 = std::rethrow_exception((exception_ptr)&local_20);
    iVar6 = auVar7._8_4_;
    uVar2 = auVar7._0_8_;
    if (local_20 != (void *)0x0) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
    if (iVar6 == 0xb) {
      lVar3 = __cxa_begin_catch(uVar2);
      uVar2 = *(undefined8 *)(lVar3 + 0x10);
      uVar5 = *(undefined8 *)(lVar3 + 0x18);
      *(undefined8 *)(lVar3 + 0x10) = 0;
      uVar1 = *(undefined8 *)(lVar3 + 0x20);
      *(undefined8 *)(lVar3 + 0x18) = 0;
      *(undefined8 *)(lVar3 + 0x20) = 0;
      PyErr_Restore(uVar2,uVar5,uVar1);
    }
    else if (iVar6 == 10) {
      plVar4 = (long *)__cxa_begin_catch(uVar2);
      (**(code **)(*plVar4 + 0x18))(plVar4);
    }
    else if (iVar6 == 9) {
      plVar4 = (long *)__cxa_begin_catch(uVar2);
      uVar2 = _PyExc_MemoryError;
      uVar5 = (**(code **)(*plVar4 + 0x10))(plVar4);
      PyErr_SetString(uVar2,uVar5);
    }
    else if (iVar6 == 8) {
      plVar4 = (long *)__cxa_begin_catch(uVar2);
      uVar2 = _PyExc_ValueError;
      uVar5 = (**(code **)(*plVar4 + 0x10))(plVar4);
      PyErr_SetString(uVar2,uVar5);
    }
    else if (iVar6 == 7) {
      plVar4 = (long *)__cxa_begin_catch(uVar2);
      uVar2 = _PyExc_ValueError;
      uVar5 = (**(code **)(*plVar4 + 0x10))(plVar4);
      PyErr_SetString(uVar2,uVar5);
    }
    else if (iVar6 == 6) {
      plVar4 = (long *)__cxa_begin_catch(uVar2);
      uVar2 = _PyExc_ValueError;
      uVar5 = (**(code **)(*plVar4 + 0x10))(plVar4);
      PyErr_SetString(uVar2,uVar5);
    }
    else if (iVar6 == 5) {
      plVar4 = (long *)__cxa_begin_catch(uVar2);
      uVar2 = _PyExc_IndexError;
      uVar5 = (**(code **)(*plVar4 + 0x10))(plVar4);
      PyErr_SetString(uVar2,uVar5);
    }
    else if (iVar6 == 4) {
      plVar4 = (long *)__cxa_begin_catch(uVar2);
      uVar2 = _PyExc_ValueError;
      uVar5 = (**(code **)(*plVar4 + 0x10))(plVar4);
      PyErr_SetString(uVar2,uVar5);
    }
    else if (iVar6 == 3) {
      plVar4 = (long *)__cxa_begin_catch(uVar2);
      uVar2 = _PyExc_OverflowError;
      uVar5 = (**(code **)(*plVar4 + 0x10))(plVar4);
      PyErr_SetString(uVar2,uVar5);
    }
    else {
      plVar4 = (long *)__cxa_begin_catch(uVar2);
      uVar2 = _PyExc_RuntimeError;
      if (iVar6 == 2) {
        uVar5 = (**(code **)(*plVar4 + 0x10))(plVar4);
        PyErr_SetString(uVar2,uVar5);
      }
      else {
        PyErr_SetString(_PyExc_RuntimeError,"Caught an unknown exception!");
      }
    }
    __cxa_end_catch();
  }
  return;
}

Assistant:

inline void translate_exception(std::exception_ptr p) {
    try {
        if (p) std::rethrow_exception(p);
    } catch (error_already_set &e)           { e.restore();                                    return;
    } catch (const builtin_exception &e)     { e.set_error();                                  return;
    } catch (const std::bad_alloc &e)        { PyErr_SetString(PyExc_MemoryError,   e.what()); return;
    } catch (const std::domain_error &e)     { PyErr_SetString(PyExc_ValueError,    e.what()); return;
    } catch (const std::invalid_argument &e) { PyErr_SetString(PyExc_ValueError,    e.what()); return;
    } catch (const std::length_error &e)     { PyErr_SetString(PyExc_ValueError,    e.what()); return;
    } catch (const std::out_of_range &e)     { PyErr_SetString(PyExc_IndexError,    e.what()); return;
    } catch (const std::range_error &e)      { PyErr_SetString(PyExc_ValueError,    e.what()); return;
    } catch (const std::overflow_error &e)   { PyErr_SetString(PyExc_OverflowError, e.what()); return;
    } catch (const std::exception &e)        { PyErr_SetString(PyExc_RuntimeError,  e.what()); return;
    } catch (...) {
        PyErr_SetString(PyExc_RuntimeError, "Caught an unknown exception!");
        return;
    }
}